

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O3

buffer_s * ox_buffer_new(size_t buffer_size)

{
  buffer_s *self;
  char *pcVar1;
  
  self = (buffer_s *)malloc(0x20);
  if (self != (buffer_s *)0x0) {
    pcVar1 = (char *)malloc(buffer_size);
    self->data = pcVar1;
    if (pcVar1 != (char *)0x0) {
      self->data_len = buffer_size;
      self->write_pos = 0;
      self->read_pos = 0;
      return self;
    }
    ox_buffer_delete(self);
  }
  return (buffer_s *)0x0;
}

Assistant:

struct buffer_s* 
ox_buffer_new(size_t buffer_size)
{
    struct buffer_s* ret = (struct buffer_s*)malloc(sizeof(struct buffer_s));
    if(ret == NULL)
    {
        return NULL;
    }

    if ((ret->data = (char*)malloc(sizeof(char)*buffer_size)) != NULL)
    {
        ret->data_len = buffer_size;
        ret->read_pos = 0;
        ret->write_pos = 0;
    }
    else
    {
        ox_buffer_delete(ret);
        ret = NULL;
    }

    return ret;
}